

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef ConvertToStackType(LlvmCompilationContext *ctx,LLVMValueRef value,TypeBase *valueType)

{
  LLVMBuilderRef pLVar1;
  LLVMTypeRef pLVar2;
  TypeBase *valueType_local;
  LLVMValueRef value_local;
  LlvmCompilationContext *ctx_local;
  
  if (valueType == ctx->ctx->typeBool) {
    pLVar1 = ctx->builder;
    pLVar2 = CompileLlvmType(ctx,ctx->ctx->typeInt);
    ctx_local = (LlvmCompilationContext *)LLVMBuildZExt(pLVar1,value,pLVar2,"");
  }
  else if (valueType == ctx->ctx->typeChar) {
    pLVar1 = ctx->builder;
    pLVar2 = CompileLlvmType(ctx,ctx->ctx->typeInt);
    ctx_local = (LlvmCompilationContext *)LLVMBuildSExt(pLVar1,value,pLVar2,"");
  }
  else if (valueType == ctx->ctx->typeShort) {
    pLVar1 = ctx->builder;
    pLVar2 = CompileLlvmType(ctx,ctx->ctx->typeInt);
    ctx_local = (LlvmCompilationContext *)LLVMBuildSExt(pLVar1,value,pLVar2,"");
  }
  else {
    ctx_local = (LlvmCompilationContext *)value;
    if (valueType == ctx->ctx->typeFloat) {
      pLVar1 = ctx->builder;
      pLVar2 = CompileLlvmType(ctx,ctx->ctx->typeDouble);
      ctx_local = (LlvmCompilationContext *)LLVMBuildFPCast(pLVar1,value,pLVar2,"");
    }
  }
  return (LLVMValueRef)ctx_local;
}

Assistant:

LLVMValueRef ConvertToStackType(LlvmCompilationContext &ctx, LLVMValueRef value, TypeBase *valueType)
{
	if(valueType == ctx.ctx.typeBool)
		return LLVMBuildZExt(ctx.builder, value, CompileLlvmType(ctx, ctx.ctx.typeInt), "");

	if(valueType == ctx.ctx.typeChar)
		return LLVMBuildSExt(ctx.builder, value, CompileLlvmType(ctx, ctx.ctx.typeInt), "");

	if(valueType == ctx.ctx.typeShort)
		return LLVMBuildSExt(ctx.builder, value, CompileLlvmType(ctx, ctx.ctx.typeInt), "");

	if(valueType == ctx.ctx.typeFloat)
		return LLVMBuildFPCast(ctx.builder, value, CompileLlvmType(ctx, ctx.ctx.typeDouble), "");

	return value;
}